

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession-decoder.c
# Opt level: O0

int mg_session_read_relationship(mg_session *session,mg_relationship **rel)

{
  int iVar1;
  mg_session *session_00;
  undefined8 *in_RSI;
  mg_session *in_RDI;
  int64_t *unaff_retaddr;
  mg_session *in_stack_00000008;
  int status;
  mg_relationship *trel;
  int status_1;
  mg_allocator *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined2 in_stack_ffffffffffffffd4;
  undefined2 uVar2;
  uint8_t in_stack_ffffffffffffffd6;
  undefined1 uVar3;
  uint8_t in_stack_ffffffffffffffd7;
  undefined1 uVar4;
  mg_session *in_stack_ffffffffffffffd8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = mg_session_check_struct_header
                    (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd6);
  if (iVar1 == 0) {
    session_00 = (mg_session *)
                 mg_allocator_malloc((mg_allocator *)
                                     CONCAT17(in_stack_ffffffffffffffd7,
                                              CONCAT16(in_stack_ffffffffffffffd6,
                                                       CONCAT24(in_stack_ffffffffffffffd4,
                                                                in_stack_ffffffffffffffd0))),
                                     (size_t)in_stack_ffffffffffffffc8);
    if (session_00 == (mg_session *)0x0) {
      mg_session_set_error(in_RDI,"out of memory");
      iVar1 = -3;
    }
    else {
      iVar1 = mg_session_read_integer(in_stack_00000008,unaff_retaddr);
      uVar2 = (undefined2)iVar1;
      uVar3 = (undefined1)((uint)iVar1 >> 0x10);
      uVar4 = (undefined1)((uint)iVar1 >> 0x18);
      if (iVar1 == 0) {
        iVar1 = mg_session_read_integer(in_stack_00000008,unaff_retaddr);
        uVar2 = (undefined2)iVar1;
        uVar3 = (undefined1)((uint)iVar1 >> 0x10);
        uVar4 = (undefined1)((uint)iVar1 >> 0x18);
        if (iVar1 == 0) {
          iVar1 = mg_session_read_integer(in_stack_00000008,unaff_retaddr);
          uVar2 = (undefined2)iVar1;
          uVar3 = (undefined1)((uint)iVar1 >> 0x10);
          uVar4 = (undefined1)((uint)iVar1 >> 0x18);
          if (iVar1 == 0) {
            iVar1 = mg_session_read_string
                              (session_00,
                               (mg_string **)
                               CONCAT17(uVar4,CONCAT16(uVar3,CONCAT24(uVar2,
                                                  in_stack_ffffffffffffffd0))));
            uVar2 = (undefined2)iVar1;
            uVar3 = (undefined1)((uint)iVar1 >> 0x10);
            uVar4 = (undefined1)((uint)iVar1 >> 0x18);
            if (iVar1 == 0) {
              iVar1 = mg_session_read_map((mg_session *)
                                          CONCAT44(in_stack_fffffffffffffffc,
                                                   in_stack_fffffffffffffff8),(mg_map **)in_RDI);
              uVar2 = (undefined2)iVar1;
              uVar3 = (undefined1)((uint)iVar1 >> 0x10);
              uVar4 = (undefined1)((uint)iVar1 >> 0x18);
              if (iVar1 == 0) {
                *in_RSI = session_00;
                return 0;
              }
              mg_string_destroy_ca
                        ((mg_string *)
                         CONCAT17(uVar4,CONCAT16(uVar3,CONCAT24(uVar2,in_stack_ffffffffffffffd0))),
                         in_stack_ffffffffffffffc8);
            }
          }
        }
      }
      mg_allocator_free((mg_allocator *)
                        CONCAT17(uVar4,CONCAT16(uVar3,CONCAT24(uVar2,in_stack_ffffffffffffffd0))),
                        in_stack_ffffffffffffffc8);
      iVar1 = CONCAT13(uVar4,CONCAT12(uVar3,uVar2));
    }
  }
  return iVar1;
}

Assistant:

int mg_session_read_relationship(mg_session *session, mg_relationship **rel) {
  MG_RETURN_IF_FAILED(mg_session_check_struct_header(
      session, (uint8_t)(MG_MARKER_TINY_STRUCT + 5),
      MG_SIGNATURE_RELATIONSHIP));

  mg_relationship *trel =
      mg_allocator_malloc(session->decoder_allocator, sizeof(mg_relationship));
  if (!trel) {
    mg_session_set_error(session, "out of memory");
    return MG_ERROR_OOM;
  }

  int status = 0;

  status = mg_session_read_integer(session, &trel->id);
  if (status != 0) {
    goto cleanup;
  }

  status = mg_session_read_integer(session, &trel->start_id);
  if (status != 0) {
    goto cleanup;
  }

  status = mg_session_read_integer(session, &trel->end_id);
  if (status != 0) {
    goto cleanup;
  }

  status = mg_session_read_string(session, &trel->type);
  if (status != 0) {
    goto cleanup;
  }

  status = mg_session_read_map(session, &trel->properties);
  if (status != 0) {
    goto cleanup_type;
  }

  *rel = trel;
  return 0;

cleanup_type:
  mg_string_destroy_ca(trel->type, session->decoder_allocator);

cleanup:
  mg_allocator_free(session->decoder_allocator, trel);
  return status;
}